

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O2

size_t __thiscall
google::protobuf::UninterpretedOption_NamePart::RequiredFieldsByteSizeFallback
          (UninterpretedOption_NamePart *this)

{
  uint uVar1;
  size_t sVar2;
  long lVar3;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) == 0) {
    lVar3 = 0;
  }
  else {
    sVar2 = internal::WireFormatLite::StringSize((this->name_part_).ptr_);
    lVar3 = sVar2 + 1;
    uVar1 = (this->_has_bits_).has_bits_[0];
  }
  return (ulong)(uVar1 & 2) + lVar3;
}

Assistant:

inline bool UninterpretedOption_NamePart::_internal_has_name_part() const {
  bool value = (_has_bits_[0] & 0x00000001u) != 0;
  return value;
}